

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void ExpectedError(string *TestCase,JSONErrorType Raised,JSONErrorType Expected)

{
  ostream *poVar1;
  string local_60;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Case: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(TestCase->_M_dataplus)._M_p,TestCase->_M_string_length)
  ;
  if (Raised == Expected) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,": The raised exception is equal the expected one! ENUM: ",0x38);
    GetEnumName_abi_cxx11_(&local_60,Raised);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,": Raised: ",10);
    GetEnumName_abi_cxx11_(&local_60,Raised);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," != Expected: ",0xe);
    GetEnumName_abi_cxx11_(&local_40,Expected);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ExpectedError(string TestCase, JSONErrorType Raised, JSONErrorType Expected)
{
    if(Raised == Expected)
        cout << "Case: " << TestCase << ": The raised exception is equal the expected one! ENUM: " << GetEnumName(Raised) << endl;
    else
        cout << "Case: " << TestCase << ": Raised: " << GetEnumName(Raised) << " != Expected: " << GetEnumName(Expected) << endl;
}